

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

VP8StatusCode
ParseHeadersInternal
          (uint8_t *data,size_t data_size,int *width,int *height,int *has_alpha,int *has_animation,
          int *format,WebPHeaderStructure *headers)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  VP8StatusCode VVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  undefined8 unaff_RBX;
  undefined7 uVar10;
  uint8_t **ppuVar11;
  WebPHeaderStructure *pWVar12;
  uint uVar13;
  VP8StatusCode VVar14;
  byte bVar15;
  int image_height;
  int image_width;
  WebPHeaderStructure hdrs;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  int *local_98;
  size_t local_90;
  uint *local_88;
  uint local_80;
  undefined4 local_7c;
  uint8_t *local_78;
  size_t sStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint8_t *local_58;
  size_t sStack_50;
  size_t local_48;
  ulong uStack_40;
  int local_38 [2];
  
  bVar15 = 0;
  iVar6 = 0;
  local_9c = 0;
  local_a0 = 0;
  if (headers != (WebPHeaderStructure *)0x0) {
    iVar6 = headers->have_all_data;
  }
  if (data_size < 0xc || data == (uint8_t *)0x0) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  local_48 = 0;
  local_58 = (uint8_t *)0x0;
  sStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  uStack_40 = 0;
  local_98 = (int *)data;
  local_90 = data_size;
  if (*(int *)data == 0x46464952) {
    VVar14 = VP8_STATUS_BITSTREAM_ERROR;
    if (*(int *)(data + 8) == 0x50424557) {
      uVar4 = *(uint *)(data + 4);
      if (uVar4 + 9 < 0x15) {
        bVar1 = false;
      }
      else if ((iVar6 == 0) || ((ulong)uVar4 <= data_size - 8)) {
        local_98 = (int *)(data + 0xc);
        local_90 = data_size - 0xc;
        bVar1 = true;
        uStack_40 = (ulong)uVar4;
      }
      else {
        bVar1 = false;
        VVar14 = VP8_STATUS_NOT_ENOUGH_DATA;
      }
      if (bVar1) goto LAB_0010fc29;
    }
  }
  else {
LAB_0010fc29:
    VVar14 = VP8_STATUS_OK;
  }
  if (VVar14 != VP8_STATUS_OK) {
    return VVar14;
  }
  uVar10 = (undefined7)((ulong)unaff_RBX >> 8);
  if (local_90 < 8) {
LAB_0010fca9:
    local_7c = (undefined4)CONCAT71(uVar10,1);
    local_a4 = 0;
    local_a8 = 0;
    bVar2 = 0;
    uVar4 = 0;
    bVar1 = false;
    VVar14 = VP8_STATUS_NOT_ENOUGH_DATA;
  }
  else {
    local_7c = (undefined4)CONCAT71(uVar10,1);
    if (*local_98 == 0x58385056) {
      VVar14 = VP8_STATUS_BITSTREAM_ERROR;
      if (local_98[1] == 10) {
        if (local_90 < 0x12) goto LAB_0010fca9;
        uVar8 = (uint)*(byte *)((long)local_98 + 0xe) * 0x10000 + (uint)*(ushort *)(local_98 + 3) +
                1;
        uVar13 = (uint)*(ushort *)((long)local_98 + 0xf) +
                 (uint)*(byte *)((long)local_98 + 0x11) * 0x10000 + 1;
        local_a4 = 0;
        local_a8 = 0;
        bVar2 = 0;
        uVar4 = 0;
        bVar1 = false;
        if ((int)((ulong)uVar8 * (ulong)uVar13 >> 0x20) == 0) {
          uVar4 = (uint)*(byte *)(local_98 + 2);
          local_98 = (int *)((long)local_98 + 0x12);
          local_90 = local_90 - 0x12;
          local_7c = 0;
          bVar2 = 1;
          local_a8 = uVar13;
          local_a4 = uVar8;
          goto LAB_0010fcfa;
        }
      }
      else {
        local_a4 = 0;
        local_a8 = 0;
        bVar2 = 0;
        uVar4 = 0;
        bVar1 = false;
      }
    }
    else {
      local_a4 = 0;
      local_a8 = 0;
      bVar2 = 0;
      uVar4 = 0;
LAB_0010fcfa:
      bVar1 = true;
      VVar14 = VP8_STATUS_OK;
    }
  }
  cVar7 = '\x01';
  if (bVar1) {
    local_80 = (uVar4 & 2) >> 1;
    VVar14 = VP8_STATUS_BITSTREAM_ERROR;
    VVar5 = VP8_STATUS_OK;
    if ((uStack_40 == 0 & ((byte)local_7c ^ 1)) == 0) {
      if (has_alpha != (int *)0x0) {
        *has_alpha = uVar4 >> 4 & 1;
      }
      if (has_animation != (int *)0x0) {
        *has_animation = local_80;
      }
      if (format != (int *)0x0) {
        *format = 0;
      }
      local_9c = local_a4;
      local_a0 = local_a8;
      bVar3 = (uVar4 & 2) != 0 & bVar2 & headers == (WebPHeaderStructure *)0x0;
      if (bVar3 != 0) {
        local_80 = 1;
      }
      cVar7 = bVar3 * '\x02';
    }
  }
  else {
    local_80 = 0;
    VVar5 = VVar14;
  }
  if (cVar7 != '\x02') {
    if (cVar7 != '\0') {
      return VVar14;
    }
    VVar14 = VP8_STATUS_NOT_ENOUGH_DATA;
    VVar5 = VVar14;
    if (((3 < local_90) &&
        (((local_88 = (uint *)height, local_78 = data, sStack_70 = data_size,
          (bVar2 & uStack_40 != 0) == 0 &&
          ((uStack_40 != 0 || bVar2 != 0 || (*local_98 != 0x48504c41)))) ||
         (VVar5 = ParseOptionalChunks((uint8_t **)&local_98,&local_90,uStack_40,&local_58,&sStack_50
                                     ), height = (int *)local_88, VVar5 == VP8_STATUS_OK)))) &&
       (VVar5 = ParseVP8Header((uint8_t **)&local_98,&local_90,iVar6,uStack_40,&local_48,local_38),
       height = (int *)local_88, VVar5 == VP8_STATUS_OK)) {
      if (0xfffffff6 < local_48) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if ((format != (int *)0x0) && (local_80 == 0)) {
        *format = 2 - (uint)(local_38[0] == 0);
      }
      if (local_38[0] == 0) {
        VVar5 = VVar14;
        if (local_90 < 10) goto LAB_0010fee1;
        iVar6 = VP8GetInfo((uint8_t *)local_98,local_90,local_48,(int *)&local_9c,(int *)&local_a0);
      }
      else {
        VVar5 = VVar14;
        if (local_90 < 5) goto LAB_0010fee1;
        iVar6 = VP8LGetInfo((uint8_t *)local_98,local_90,(int *)&local_9c,(int *)&local_a0,has_alpha
                           );
      }
      if (iVar6 == 0) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if ((char)local_7c == '\0') {
        if (local_a4 != local_9c) {
          return VP8_STATUS_BITSTREAM_ERROR;
        }
        if (local_a8 != local_a0) {
          return VP8_STATUS_BITSTREAM_ERROR;
        }
      }
      height = (int *)local_88;
      VVar5 = VP8_STATUS_OK;
      if (headers != (WebPHeaderStructure *)0x0) {
        ppuVar11 = &local_78;
        pWVar12 = headers;
        for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
          pWVar12->data = *ppuVar11;
          ppuVar11 = ppuVar11 + (ulong)bVar15 * -2 + 1;
          pWVar12 = (WebPHeaderStructure *)((long)pWVar12 + (ulong)bVar15 * -0x10 + 8);
        }
        headers->offset = (long)local_98 - (long)headers->data;
      }
    }
  }
LAB_0010fee1:
  if ((VVar5 == VP8_STATUS_OK) ||
     ((headers == (WebPHeaderStructure *)0x0 &&
      ((bool)(bVar2 & VVar5 == VP8_STATUS_NOT_ENOUGH_DATA))))) {
    if (has_alpha != (int *)0x0) {
      *has_alpha = *has_alpha | (uint)(local_58 != (uint8_t *)0x0);
    }
    if (width != (int *)0x0) {
      *width = local_9c;
    }
    VVar5 = VP8_STATUS_OK;
    if ((uint *)height != (uint *)0x0) {
      *height = local_a0;
    }
  }
  return VVar5;
}

Assistant:

static VP8StatusCode ParseHeadersInternal(const uint8_t* data,
                                          size_t data_size,
                                          int* const width,
                                          int* const height,
                                          int* const has_alpha,
                                          int* const has_animation,
                                          int* const format,
                                          WebPHeaderStructure* const headers) {
  int canvas_width = 0;
  int canvas_height = 0;
  int image_width = 0;
  int image_height = 0;
  int found_riff = 0;
  int found_vp8x = 0;
  int animation_present = 0;
  const int have_all_data = (headers != NULL) ? headers->have_all_data : 0;

  VP8StatusCode status;
  WebPHeaderStructure hdrs;

  if (data == NULL || data_size < RIFF_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  memset(&hdrs, 0, sizeof(hdrs));
  hdrs.data = data;
  hdrs.data_size = data_size;

  // Skip over RIFF header.
  status = ParseRIFF(&data, &data_size, have_all_data, &hdrs.riff_size);
  if (status != VP8_STATUS_OK) {
    return status;   // Wrong RIFF header / insufficient data.
  }
  found_riff = (hdrs.riff_size > 0);

  // Skip over VP8X.
  {
    uint32_t flags = 0;
    status = ParseVP8X(&data, &data_size, &found_vp8x,
                       &canvas_width, &canvas_height, &flags);
    if (status != VP8_STATUS_OK) {
      return status;  // Wrong VP8X / insufficient data.
    }
    animation_present = !!(flags & ANIMATION_FLAG);
    if (!found_riff && found_vp8x) {
      // Note: This restriction may be removed in the future, if it becomes
      // necessary to send VP8X chunk to the decoder.
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (has_alpha != NULL) *has_alpha = !!(flags & ALPHA_FLAG);
    if (has_animation != NULL) *has_animation = animation_present;
    if (format != NULL) *format = 0;   // default = undefined

    image_width = canvas_width;
    image_height = canvas_height;
    if (found_vp8x && animation_present && headers == NULL) {
      status = VP8_STATUS_OK;
      goto ReturnWidthHeight;  // Just return features from VP8X header.
    }
  }

  if (data_size < TAG_SIZE) {
    status = VP8_STATUS_NOT_ENOUGH_DATA;
    goto ReturnWidthHeight;
  }

  // Skip over optional chunks if data started with "RIFF + VP8X" or "ALPH".
  if ((found_riff && found_vp8x) ||
      (!found_riff && !found_vp8x && !memcmp(data, "ALPH", TAG_SIZE))) {
    status = ParseOptionalChunks(&data, &data_size, hdrs.riff_size,
                                 &hdrs.alpha_data, &hdrs.alpha_data_size);
    if (status != VP8_STATUS_OK) {
      goto ReturnWidthHeight;  // Invalid chunk size / insufficient data.
    }
  }

  // Skip over VP8/VP8L header.
  status = ParseVP8Header(&data, &data_size, have_all_data, hdrs.riff_size,
                          &hdrs.compressed_size, &hdrs.is_lossless);
  if (status != VP8_STATUS_OK) {
    goto ReturnWidthHeight;  // Wrong VP8/VP8L chunk-header / insufficient data.
  }
  if (hdrs.compressed_size > MAX_CHUNK_PAYLOAD) {
    return VP8_STATUS_BITSTREAM_ERROR;
  }

  if (format != NULL && !animation_present) {
    *format = hdrs.is_lossless ? 2 : 1;
  }

  if (!hdrs.is_lossless) {
    if (data_size < VP8_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8 data.
    if (!VP8GetInfo(data, data_size, (uint32_t)hdrs.compressed_size,
                    &image_width, &image_height)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  } else {
    if (data_size < VP8L_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8L data.
    if (!VP8LGetInfo(data, data_size, &image_width, &image_height, has_alpha)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  // Validates image size coherency.
  if (found_vp8x) {
    if (canvas_width != image_width || canvas_height != image_height) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  if (headers != NULL) {
    *headers = hdrs;
    headers->offset = data - headers->data;
    assert((uint64_t)(data - headers->data) < MAX_CHUNK_PAYLOAD);
    assert(headers->offset == headers->data_size - data_size);
  }
 ReturnWidthHeight:
  if (status == VP8_STATUS_OK ||
      (status == VP8_STATUS_NOT_ENOUGH_DATA && found_vp8x && headers == NULL)) {
    if (has_alpha != NULL) {
      // If the data did not contain a VP8X/VP8L chunk the only definitive way
      // to set this is by looking for alpha data (from an ALPH chunk).
      *has_alpha |= (hdrs.alpha_data != NULL);
    }
    if (width != NULL) *width = image_width;
    if (height != NULL) *height = image_height;
    return VP8_STATUS_OK;
  } else {
    return status;
  }
}